

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O1

OPJ_BOOL opj_set_MCT(opj_cparameters_t *parameters,OPJ_FLOAT32 *pEncodingMatrix,
                    OPJ_INT32 *p_dc_shift,OPJ_UINT32 pNbComp)

{
  ushort uVar1;
  ushort uVar2;
  void *__dest;
  uint uVar3;
  
  uVar3 = pNbComp * 4 * pNbComp;
  uVar1 = (ushort)*(undefined4 *)&parameters->rsiz;
  uVar2 = 0x8100;
  if ((short)uVar1 < 0) {
    uVar2 = uVar1 | 0x100;
  }
  parameters->rsiz = uVar2;
  parameters->irreversible = 1;
  parameters->tcp_mct = '\x02';
  __dest = opj_malloc((ulong)(uVar3 + pNbComp * 4));
  parameters->mct_data = __dest;
  if (__dest != (void *)0x0) {
    memcpy(__dest,pEncodingMatrix,(ulong)uVar3);
    memcpy((void *)((ulong)uVar3 + (long)parameters->mct_data),p_dc_shift,(ulong)(pNbComp * 4));
  }
  return (uint)(__dest != (void *)0x0);
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_set_MCT(opj_cparameters_t *parameters,
                                  OPJ_FLOAT32 * pEncodingMatrix,
                                  OPJ_INT32 * p_dc_shift, OPJ_UINT32 pNbComp)
{
    OPJ_UINT32 l_matrix_size = pNbComp * pNbComp * (OPJ_UINT32)sizeof(OPJ_FLOAT32);
    OPJ_UINT32 l_dc_shift_size = pNbComp * (OPJ_UINT32)sizeof(OPJ_INT32);
    OPJ_UINT32 l_mct_total_size = l_matrix_size + l_dc_shift_size;

    /* add MCT capability */
    if (OPJ_IS_PART2(parameters->rsiz)) {
        parameters->rsiz |= OPJ_EXTENSION_MCT;
    } else {
        parameters->rsiz = ((OPJ_PROFILE_PART2) | (OPJ_EXTENSION_MCT));
    }
    parameters->irreversible = 1;

    /* use array based MCT */
    parameters->tcp_mct = 2;
    parameters->mct_data = opj_malloc(l_mct_total_size);
    if (! parameters->mct_data) {
        return OPJ_FALSE;
    }

    memcpy(parameters->mct_data, pEncodingMatrix, l_matrix_size);
    memcpy(((OPJ_BYTE *) parameters->mct_data) +  l_matrix_size, p_dc_shift,
           l_dc_shift_size);

    return OPJ_TRUE;
}